

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeTypeFaceWrapper.cpp
# Opt level: O0

string * __thiscall
FreeTypeFaceWrapper::NotDefGlyphName_abi_cxx11_
          (string *__return_storage_ptr__,FreeTypeFaceWrapper *this)

{
  bool bVar1;
  FT_UInt FVar2;
  long lVar3;
  string local_48;
  uint local_24;
  char *pcStack_20;
  FT_UInt gindex;
  char *aString;
  FreeTypeFaceWrapper *this_local;
  
  aString = (char *)this;
  this_local = (FreeTypeFaceWrapper *)__return_storage_ptr__;
  lVar3 = std::__cxx11::string::length();
  if (lVar3 == 0) {
    if ((this->mFace->face_flags & 0x200U) != 0) {
      pcStack_20 = ".notdef";
      FVar2 = FT_Get_Name_Index(this->mFace,".notdef");
      if ((FVar2 == 0) && (FT_Get_First_Char(this->mFace,&local_24), local_24 != 0)) {
        GetGlyphName_abi_cxx11_(&local_48,this,local_24,true);
        std::__cxx11::string::operator=((string *)&this->mNotDefGlyphName,(string *)&local_48);
        std::__cxx11::string::~string((string *)&local_48);
      }
    }
    bVar1 = std::operator==(&this->mNotDefGlyphName,"");
    if (bVar1) {
      std::__cxx11::string::operator=((string *)&this->mNotDefGlyphName,".notdef");
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->mNotDefGlyphName);
  return __return_storage_ptr__;
}

Assistant:

std::string FreeTypeFaceWrapper::NotDefGlyphName()
{
    // for special case of fonts that have glyph names, but don't define .notdef, use one of the existing chars (found a custom type 1 with that)
    
    if (mNotDefGlyphName.length() == 0) {
		if(FT_HAS_GLYPH_NAMES(mFace))
		{
			char* aString = (char*)".notdef";
			if(FT_Get_Name_Index(mFace,aString) == 0) {
				FT_UInt   gindex;
				FT_Get_First_Char( mFace, &gindex ); 
				if (gindex != 0)
				  mNotDefGlyphName = GetGlyphName(gindex, true);
			}
		}
		if (mNotDefGlyphName == "")  mNotDefGlyphName = ".notdef";
	}
	return mNotDefGlyphName;
}